

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O2

int Cnf_DataSolveFromFile
              (char *pFileName,int nConfLimit,int nLearnedStart,int nLearnedDelta,int nLearnedPerce,
              int fVerbose,int fShowPattern,int **ppModel,int nPis)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Cnf_Dat_t *p;
  abctime aVar5;
  sat_solver *s;
  int *piVar6;
  char *pcVar7;
  abctime time;
  abctime time_00;
  char *format;
  int level;
  FILE *pFVar9;
  ulong uVar10;
  int iVar11;
  sat_solver *psVar8;
  
  aVar4 = Abc_Clock();
  p = Cnf_DataReadFromFile(pFileName);
  if (p == (Cnf_Dat_t *)0x0) {
    iVar11 = -1;
  }
  else {
    if (fVerbose != 0) {
      pcVar7 = (char *)(ulong)(uint)p->nVars;
      printf("CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ",pcVar7,
             (ulong)(uint)p->nClauses,(ulong)(uint)p->nLiterals);
      aVar5 = Abc_Clock();
      Abc_PrintTime((int)aVar5 - (int)aVar4,pcVar7,time);
    }
    s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
    if (s == (sat_solver *)0x0) {
      puts("The problem is trivially UNSAT.");
      Cnf_DataFree(p);
      iVar11 = 1;
    }
    else {
      if (nLearnedStart != 0) {
        s->nLearntMax = nLearnedStart;
        s->nLearntStart = nLearnedStart;
      }
      if (nLearnedDelta != 0) {
        s->nLearntDelta = nLearnedDelta;
      }
      if (nLearnedPerce != 0) {
        s->nLearntRatio = nLearnedPerce;
      }
      if (fVerbose != 0) {
        s->fVerbose = fVerbose;
      }
      iVar11 = 0;
      psVar8 = s;
      iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)nConfLimit,0,0,0);
      level = (int)psVar8;
      if (iVar2 == 0) {
        iVar11 = -1;
        bVar1 = false;
      }
      else {
        bVar1 = true;
        if (iVar2 != 1) {
          if (iVar2 != -1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfUtil.c"
                          ,0x1bb,
                          "int Cnf_DataSolveFromFile(char *, int, int, int, int, int, int, int **, int)"
                         );
          }
          bVar1 = false;
          iVar11 = 1;
        }
      }
      if (fVerbose != 0) {
        pFVar9 = _stdout;
        Sat_SolverPrintStats(_stdout,s);
        level = (int)pFVar9;
      }
      pcVar7 = "UNSATISFIABLE  ";
      if (bVar1) {
        pcVar7 = "SATISFIABLE    ";
      }
      format = "UNDECIDED      ";
      if (iVar2 != 0) {
        format = pcVar7;
      }
      Abc_Print(level,format);
      aVar5 = Abc_Clock();
      Abc_PrintTime((int)aVar5 - (int)aVar4,format,time_00);
      if (0 < nPis && !(bool)(bVar1 ^ 1U)) {
        piVar6 = (int *)malloc((ulong)(uint)nPis * 4);
        *ppModel = piVar6;
        for (uVar10 = 0; (uint)nPis != uVar10; uVar10 = uVar10 + 1) {
          iVar2 = sat_solver_var_value(s,((int)uVar10 - nPis) + p->nVars);
          (*ppModel)[uVar10] = iVar2;
        }
      }
      if (fShowPattern != 0 && !(bool)(bVar1 ^ 1U)) {
        for (iVar2 = 0; iVar2 < p->nVars; iVar2 = iVar2 + 1) {
          uVar3 = sat_solver_var_value(s,iVar2);
          printf("%d",(ulong)uVar3);
        }
        putchar(10);
      }
      Cnf_DataFree(p);
      sat_solver_delete(s);
    }
  }
  return iVar11;
}

Assistant:

int Cnf_DataSolveFromFile( char * pFileName, int nConfLimit, int nLearnedStart, int nLearnedDelta, int nLearnedPerce, int fVerbose, int fShowPattern, int ** ppModel, int nPis )
{
    abctime clk = Abc_Clock();
    Cnf_Dat_t * pCnf = Cnf_DataReadFromFile( pFileName );
    sat_solver * pSat;
    int i, status, RetValue = -1;
    if ( pCnf == NULL )
        return -1;
    if ( fVerbose )
    {
        printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    // convert into SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        printf( "The problem is trivially UNSAT.\n" );
        Cnf_DataFree( pCnf );
        return 1;
    }
    if ( nLearnedStart )
        pSat->nLearntStart = pSat->nLearntMax = nLearnedStart;
    if ( nLearnedDelta )
        pSat->nLearntDelta = nLearnedDelta;
    if ( nLearnedPerce )
        pSat->nLearntRatio = nLearnedPerce;
    if ( fVerbose )
        pSat->fVerbose = fVerbose;

//sat_solver_start_cardinality( pSat, 100 );

    // solve the miter
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, 0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_Undef )
        RetValue = -1;
    else if ( status == l_True )
        RetValue = 0;
    else if ( status == l_False )
        RetValue = 1;
    else
        assert( 0 );
    if ( fVerbose )
        Sat_SolverPrintStats( stdout, pSat );
    if ( RetValue == -1 )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "SATISFIABLE    " );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );
    //Abc_Print( -1, "\n" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // derive SAT assignment
    if ( RetValue == 0 && nPis > 0 )
    {
        *ppModel = ABC_ALLOC( int, nPis );
        for ( i = 0; i < nPis; i++ )
            (*ppModel)[i] = sat_solver_var_value( pSat, pCnf->nVars - nPis + i );
    }
    if ( RetValue == 0 && fShowPattern )
    {
        for ( i = 0; i < pCnf->nVars; i++ )
            printf( "%d", sat_solver_var_value(pSat,i) );
        printf( "\n" );
    }
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    return RetValue;
}